

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::reorg_gradient
               (bool add_to,tensor *grad,int row_stride,int col_stride,tensor *gradient_input)

{
  uint *puVar1;
  thread_pool_implementation *this;
  task_state_type *ptVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread_pool *ptVar7;
  unsigned_long uVar8;
  pthread_t id;
  long lVar9;
  code *pcVar10;
  uint64 uVar11;
  ostream *poVar12;
  fatal_error *pfVar13;
  long lVar14;
  long *plVar15;
  long lVar16;
  long i;
  long lVar17;
  ostringstream dlib_o_out;
  float *g;
  float *gi;
  bool local_229;
  string local_228;
  int local_208;
  int local_204;
  long local_200;
  thread_pool *local_1f8;
  long local_1f0;
  anon_class_56_7_7c6c4572 local_1e8 [6];
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2453:59)>
  *local_70;
  code *local_68;
  long local_60;
  long local_58;
  long local_50;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2453:59)>
  local_48;
  float *local_40;
  float *local_38;
  
  local_229 = add_to;
  local_208 = col_stride;
  local_204 = row_stride;
  if (grad == gradient_input) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x98a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"!is_same_object(grad, gradient_input)",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Grad and gradient_input must be distinct objects.",0x31);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  lVar16 = (long)row_stride;
  if (grad->m_nr % lVar16 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x98b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"grad.nr() % row_stride == 0",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"The number of rows in grad must be divisible by row_stride.",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  lVar9 = grad->m_nc;
  lVar14 = (long)col_stride;
  if (lVar9 % lVar14 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x98c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"grad.nc() % col_stride == 0",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"The number of columns in grad must be divisible by col_stride."
               ,0x3e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if (grad->m_n == gradient_input->m_n) {
    lVar6 = gradient_input->m_k / lVar16;
    if (grad->m_k != lVar6 / lVar14) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x98e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                 ,0x54);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"grad.k() == gradient_input.k() / row_stride / col_stride",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
      puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "The number of channels in grad must be gradient_input.k() divided by row_stride and col_stride."
                 ,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
      pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
      __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
    }
    if (grad->m_nr == lVar16 * gradient_input->m_nr) {
      if (lVar9 == lVar14 * gradient_input->m_nc) {
        iVar5 = (*gradient_input->_vptr_tensor[2])(gradient_input,lVar9,lVar6 % lVar14);
        local_38 = (float *)CONCAT44(extraout_var,iVar5);
        iVar5 = (*grad->_vptr_tensor[3])(grad);
        local_40 = (float *)CONCAT44(extraout_var_00,iVar5);
        local_1e8[0].g = &local_40;
        local_1e8[0].row_stride = &local_204;
        lVar16 = gradient_input->m_n;
        local_1e8[0].col_stride = &local_208;
        local_1e8[0].add_to = &local_229;
        local_1e8[0].gradient_input = gradient_input;
        local_1e8[0].grad = grad;
        local_1e8[0].gi = &local_38;
        ptVar7 = default_thread_pool();
        local_70 = &local_48;
        local_68 = impl::
                   helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>
                   ::run;
        local_60 = 0;
        local_48.funct = local_1e8;
        uVar8 = thread_pool_implementation::num_threads_in_pool
                          ((ptVar7->impl).
                           super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (uVar8 == 0) {
          if (0 < lVar16) {
            lVar9 = 0;
            do {
              impl::
              helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>
              ::run(&local_48,lVar9);
              lVar9 = lVar9 + 1;
            } while (lVar16 != lVar9);
          }
        }
        else {
          uVar8 = thread_pool_implementation::num_threads_in_pool
                            ((ptVar7->impl).
                             super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          lVar14 = lVar16 / (long)(uVar8 << 3);
          lVar9 = 1;
          if (1 < lVar14) {
            lVar9 = lVar14;
          }
          if (0 < lVar16) {
            lVar14 = 0;
            lVar6 = lVar9;
            local_200 = lVar9;
            local_1f8 = ptVar7;
            local_1f0 = lVar16;
            do {
              local_58 = lVar14 + lVar9;
              lVar17 = lVar6;
              if (lVar16 < lVar6) {
                lVar17 = lVar16;
              }
              this = (ptVar7->impl).
                     super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
              if (local_58 < lVar16) {
                lVar16 = local_58;
              }
              local_228._M_dataplus._M_p = (pointer)&this->m;
              local_228._M_string_length = 0;
              local_228.field_2._M_allocated_capacity = 0;
              local_50 = lVar6;
              pthread_mutex_lock((pthread_mutex_t *)local_228._M_dataplus._M_p);
              id = pthread_self();
              lVar9 = thread_pool_implementation::find_empty_task_slot(this);
              if ((lVar9 == -1) &&
                 (bVar4 = thread_pool_implementation::is_worker_thread(this,id), bVar4)) {
                auto_mutex::unlock((auto_mutex *)&local_228);
                lVar16 = local_1f0;
                ptVar7 = local_1f8;
                lVar9 = local_200;
                do {
                  plVar15 = (long *)((long)&local_70->funct + local_60);
                  pcVar10 = local_68;
                  if (((ulong)local_68 & 1) != 0) {
                    pcVar10 = *(code **)(local_68 + *plVar15 + -1);
                  }
                  (*pcVar10)(plVar15,lVar14);
                  lVar14 = lVar14 + 1;
                } while (lVar17 != lVar14);
              }
              else {
                while (lVar9 == -1) {
                  pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                                    (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
                  lVar9 = thread_pool_implementation::find_empty_task_slot(this);
                }
                (this->tasks).array_elements[lVar9].thread_id = id;
                uVar11 = thread_pool_implementation::make_next_task_id(this,lVar9);
                ptVar2 = (this->tasks).array_elements;
                ptVar2[lVar9].task_id = uVar11;
                (*(code *)**ptVar2[lVar9].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
                puVar3 = (undefined8 *)
                         ptVar2[lVar9].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
                puVar3[1] = &local_70;
                *(undefined4 *)(puVar3 + 2) = 0;
                puVar3[3] = impl::
                            helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>_>
                            ::process_block;
                puVar3[4] = 0;
                *puVar3 = &PTR__mp_base_base_001fa708;
                ptVar2 = (this->tasks).array_elements;
                ptVar2[lVar9].arg1 = lVar14;
                ptVar2[lVar9].arg2 = lVar16;
                pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
                lVar9 = local_200;
                lVar16 = local_1f0;
                ptVar7 = local_1f8;
              }
              auto_mutex::unlock((auto_mutex *)&local_228);
              lVar6 = local_50 + lVar9;
              lVar14 = local_58;
            } while (local_58 < lVar16);
          }
          thread_pool_implementation::wait_for_all_tasks
                    ((ptVar7->impl).
                     super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x990);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                 ,0x54);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"grad.nc() == gradient_input.nc() * col_stride",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
      puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
      *puVar1 = *puVar1 | 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "The number of columns in grad must be gradient_input.nc() multiplied by col_stride."
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
      pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
      __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x98f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"grad.nr() == gradient_input.nr() * row_stride",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
    puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,
               "The number of rows in grad must be gradient_input.nr() multiplied by row_stride.",
               0x50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"\n\nError detected at line ",0x19);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,0x98d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,
             "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"grad.num_samples() == gradient_input.num_samples()",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,".\n",2);
  puVar1 = (uint *)((long)&local_1e8[0].col_stride + local_1e8[0].gradient_input[-1].m_nr);
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"The number of samples in grad and gradient_input must match.",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
  pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_228);
  __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
}

Assistant:

void reorg_gradient(
            bool add_to,
            tensor& grad,
            const int row_stride,
            const int col_stride,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(!is_same_object(grad, gradient_input), "Grad and gradient_input must be distinct objects.");
            DLIB_CASSERT(grad.nr() % row_stride == 0, "The number of rows in grad must be divisible by row_stride.");
            DLIB_CASSERT(grad.nc() % col_stride == 0, "The number of columns in grad must be divisible by col_stride.");
            DLIB_CASSERT(grad.num_samples() == gradient_input.num_samples(), "The number of samples in grad and gradient_input must match.");
            DLIB_CASSERT(grad.k() == gradient_input.k() / row_stride / col_stride, "The number of channels in grad must be gradient_input.k() divided by row_stride and col_stride.");
            DLIB_CASSERT(grad.nr() == gradient_input.nr() * row_stride, "The number of rows in grad must be gradient_input.nr() multiplied by row_stride.");
            DLIB_CASSERT(grad.nc() == gradient_input.nc() * col_stride, "The number of columns in grad must be gradient_input.nc() multiplied by col_stride.");

            const float* gi = gradient_input.host();
            float* g = grad.host();

            parallel_for(0, gradient_input.num_samples(), [&](long n)
            {
                for (long k = 0; k < gradient_input.k(); ++k)
                {
                    for (long r = 0; r < gradient_input.nr(); ++r)
                    {
                        for (long c = 0; c < gradient_input.nc(); ++c)
                        {
                                const auto in_idx = tensor_index(gradient_input, n, k, r, c);
                                const auto out_idx = tensor_index(grad,
                                    n,
                                    k % grad.k(),
                                    r * row_stride + (k / grad.k()) / col_stride,
                                    c * col_stride + (k / grad.k()) % col_stride);
                                
                                if (add_to) g[out_idx] += gi[in_idx];
                                else g[out_idx] = gi[in_idx];
                        }
                    }
                }
            });
        }